

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_encoder.cc
# Opt level: O2

bool __thiscall
draco::KdTreeAttributesEncoder::EncodeDataNeededByPortableTransforms
          (KdTreeAttributesEncoder *this,EncoderBuffer *out_buffer)

{
  pointer pAVar1;
  pointer piVar2;
  long lVar3;
  int i;
  ulong uVar4;
  int i_1;
  long lVar5;
  
  lVar5 = 0;
  uVar4 = 0;
  while( true ) {
    pAVar1 = (this->attribute_quantization_transforms_).
             super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->attribute_quantization_transforms_).
                  super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
    if ((ulong)(lVar3 / 0x30) <= uVar4) break;
    (**(code **)(*(long *)((long)&(pAVar1->super_AttributeTransform)._vptr_AttributeTransform +
                          lVar5) + 0x38))
              ((long)&(pAVar1->super_AttributeTransform)._vptr_AttributeTransform + lVar5,out_buffer
               ,lVar3 % 0x30);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x30;
  }
  for (uVar4 = 0;
      piVar2 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
      uVar4 = uVar4 + 1) {
    EncodeVarint<int>(piVar2[uVar4],out_buffer);
  }
  return true;
}

Assistant:

bool KdTreeAttributesEncoder::EncodeDataNeededByPortableTransforms(
    EncoderBuffer *out_buffer) {
  // Store quantization settings for all attributes that need it.
  for (int i = 0; i < attribute_quantization_transforms_.size(); ++i) {
    attribute_quantization_transforms_[i].EncodeParameters(out_buffer);
  }

  // Encode data needed for transforming signed integers to unsigned ones.
  for (int i = 0; i < min_signed_values_.size(); ++i) {
    EncodeVarint<int32_t>(min_signed_values_[i], out_buffer);
  }
  return true;
}